

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

void ecpSubAJ(word *c,word *a,word *b,ec_o *ec,void *stack)

{
  word *in_RCX;
  word *in_RDX;
  void *in_RSI;
  ec_o *in_RDI;
  word *in_R8;
  word *t;
  size_t n;
  word *mod;
  word *a_00;
  
  mod = *(word **)(in_RCX[3] + 0x30);
  a_00 = in_R8 + (long)mod * 2;
  wwCopy(in_R8,in_RDX,*(size_t *)(in_RCX[3] + 0x30));
  zzNegMod(in_RCX,a_00,mod,(size_t)in_R8);
  ecpAddAJ((word *)stack,(word *)n,t,in_RDI,in_RSI);
  return;
}

Assistant:

static void ecpSubAJ(word c[], const word a[], const word b[], const ec_o* ec,
	void* stack)
{
	const size_t n = ec->f->n;
	// переменные в stack
	word* t = (word*)stack;
	stack = t + 2 * n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOn3(a, ec));
	ASSERT(ecpSeemsOnA(b, ec));
	ASSERT(wwIsSameOrDisjoint(a,  c, 3 * n));
	ASSERT(b == c || wwIsDisjoint2(b, 2 * n, c, 3 * n));
	// t <- -b
	qrCopy(ecX(t), ecX(b), ec->f);
	zmNeg(ecY(t, n), ecY(b, n), ec->f);
	// c <- a + t
	ecpAddAJ(c, a, t, ec, stack);
}